

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overload_1.cxx
# Opt level: O2

int __thiscall Int::operator_cast_to_int(Int *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_782);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,"]");
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return this->value;
}

Assistant:

operator int() {
        std::cout << "int型で返却しました[" << this << "]" << ":" << value << std::endl;
        return value;
    }